

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitTupleExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,TupleExpr *expr)

{
  pointer puVar1;
  Expr *pEVar2;
  ostream *poVar3;
  pointer puVar4;
  string separator;
  string local_1c8 [32];
  ostringstream s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  std::operator<<((ostream *)&s,'(');
  separator._M_dataplus._M_p = (pointer)&separator.field_2;
  separator._M_string_length = 0;
  separator.field_2._M_local_buf[0] = '\0';
  puVar1 = (expr->elems).
           super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (expr->elems).
                super__Vector_base<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&s,(string *)&separator);
    pEVar2 = (puVar4->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
             super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
    (*pEVar2->_vptr_Expr[2])(local_1c8,pEVar2,&this->field_0x8);
    std::operator<<(poVar3,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::assign((char *)&separator);
  }
  std::operator<<((ostream *)&s,')');
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&separator);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitTupleExpr(TupleExpr &expr) {
        std::ostringstream s;
        s << '(';

        std::string separator;
        for (const std::unique_ptr<Expr>& elem : expr.elems) {
            s << separator << visitExpr(*elem);
            separator = ", ";
        }

        s << ')';
        return s.str();
    }